

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

bool __thiscall
QRegularExpressionMatch::hasCaptured(QRegularExpressionMatch *this,QAnyStringView name)

{
  QRegularExpressionMatchPrivate *pQVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = QRegularExpressionPrivate::captureIndexForName
                    ((((this->d).d.ptr)->regularExpression).d.d.ptr,name);
  if ((iVar2 < 0) || (pQVar1 = (this->d).d.ptr, pQVar1->capturedCount <= iVar2)) {
    bVar3 = false;
  }
  else {
    bVar3 = (pQVar1->capturedOffsets).d.ptr[(uint)(iVar2 * 2)] != -1;
  }
  return bVar3;
}

Assistant:

bool QRegularExpressionMatch::hasCaptured(QAnyStringView name) const
{
    const int nth = d->regularExpression.d->captureIndexForName(name);
    return hasCaptured(nth);
}